

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChCollisionSystem.h
# Opt level: O2

void __thiscall chrono::collision::ChCollisionSystem::~ChCollisionSystem(ChCollisionSystem *this)

{
  code *pcVar1;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

virtual ~ChCollisionSystem() {}